

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteElemTableInit
          (CWriter *this,bool active_initialization,ElemSegment *src_segment,Table *dst_table)

{
  Enum EVar1;
  Enum EVar2;
  bool bVar3;
  Newline local_e9;
  string_view local_e8;
  Type local_d4;
  StackVar local_cc;
  Type local_c0;
  StackVar local_b8;
  Type local_ac;
  StackVar local_a4;
  string_view local_98;
  size_type local_88;
  GlobalName local_80;
  size_type local_70;
  size_type local_68;
  GlobalName local_60;
  string_view local_50;
  ExternalInstancePtr local_40;
  char *local_30;
  Table *local_28;
  Table *dst_table_local;
  ElemSegment *src_segment_local;
  CWriter *pCStack_10;
  bool active_initialization_local;
  CWriter *this_local;
  
  local_28 = dst_table;
  dst_table_local = (Table *)src_segment;
  src_segment_local._7_1_ = active_initialization;
  pCStack_10 = this;
  EVar1 = Type::operator_cast_to_Enum(&dst_table->elem_type);
  bVar3 = true;
  if (EVar1 != FuncRef) {
    EVar1 = Type::operator_cast_to_Enum(&local_28->elem_type);
    bVar3 = EVar1 == ExternRef;
  }
  if (bVar3) {
    EVar1 = Type::operator_cast_to_Enum(&local_28->elem_type);
    EVar2 = Type::operator_cast_to_Enum((Type *)&dst_table_local[1].elem_limits.has_max);
    if (EVar1 != EVar2) {
      __assert_fail("dst_table->elem_type == src_segment->elem_type",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                    ,0x774,
                    "void wabt::(anonymous namespace)::CWriter::WriteElemTableInit(bool, const ElemSegment *, const Table *)"
                   );
    }
    local_30 = GetReferenceTypeName(&local_28->elem_type);
    ExternalInstancePtr::GlobalName(&local_40,Table,&local_28->name);
    (anonymous_namespace)::CWriter::
    Write<char_const*,char_const(&)[13],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[3]>
              ((CWriter *)this,&local_30,(char (*) [13])"_table_init(",&local_40,
               (char (*) [3])0x221c3d);
    EVar1 = Type::operator_cast_to_Enum(&local_28->elem_type);
    if (EVar1 == FuncRef) {
      bVar3 = std::
              vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
              ::empty((vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                       *)&dst_table_local[2].name.field_2);
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"NULL, ")
        ;
        Write(this,local_50);
      }
      else {
        GlobalName::GlobalName
                  (&local_60,ElemSegment,(string *)&(dst_table_local->name)._M_string_length);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[20],wabt::(anonymous_namespace)::GlobalName,char_const(&)[3]>
                  ((CWriter *)this,(char (*) [20])0x21e547,&local_60,(char (*) [3])0x221c3d);
      }
    }
    if ((src_segment_local._7_1_ & 1) == 0) {
      bVar3 = is_droppable((ElemSegment *)dst_table_local);
      if (bVar3) {
        GlobalName::GlobalName
                  (&local_80,ElemSegment,(string *)&(dst_table_local->name)._M_string_length);
        local_88 = std::
                   vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                   ::size((vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                           *)&dst_table_local[2].name.field_2);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[33],wabt::(anonymous_namespace)::GlobalName,char_const(&)[8],unsigned_long,char_const(&)[4]>
                  ((CWriter *)this,(char (*) [33])"(instance->elem_segment_dropped_",&local_80,
                   (char (*) [8])" ? 0 : ",&local_88,(char (*) [4])0x221c3c);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"0, ");
        Write(this,local_98);
      }
      Type::Type(&local_ac,Any);
      StackVar::StackVar(&local_a4,2,local_ac);
      Type::Type(&local_c0,Any);
      StackVar::StackVar(&local_b8,1,local_c0);
      Type::Type(&local_d4,Any);
      StackVar::StackVar(&local_cc,0,local_d4);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar>
                ((CWriter *)this,&local_a4,(char (*) [3])0x221c3d,&local_b8,(char (*) [3])0x221c3d,
                 &local_cc);
    }
    else {
      local_68 = std::
                 vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                 ::size((vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                         *)&dst_table_local[2].name.field_2);
      (anonymous_namespace)::CWriter::Write<unsigned_long,char_const(&)[3]>
                ((CWriter *)this,&local_68,(char (*) [3])0x221c3d);
      WriteInitExpr(this,(ExprList *)&dst_table_local[1].elem_type);
      local_70 = std::
                 vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                 ::size((vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                         *)&dst_table_local[2].name.field_2);
      (anonymous_namespace)::CWriter::Write<char_const(&)[6],unsigned_long>
                ((CWriter *)this,(char (*) [6])", 0, ",&local_70);
    }
    EVar1 = Type::operator_cast_to_Enum(&local_28->elem_type);
    if (EVar1 == FuncRef) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e8,", instance");
      Write(this,local_e8);
    }
    (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [3])0x221bfb,&local_e9);
    return;
  }
  __assert_fail("dst_table->elem_type == Type::FuncRef || dst_table->elem_type == Type::ExternRef",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x773,
                "void wabt::(anonymous namespace)::CWriter::WriteElemTableInit(bool, const ElemSegment *, const Table *)"
               );
}

Assistant:

void CWriter::WriteElemTableInit(bool active_initialization,
                                 const ElemSegment* src_segment,
                                 const Table* dst_table) {
  assert(dst_table->elem_type == Type::FuncRef ||
         dst_table->elem_type == Type::ExternRef);
  assert(dst_table->elem_type == src_segment->elem_type);

  Write(GetReferenceTypeName(dst_table->elem_type), "_table_init(",
        ExternalInstancePtr(ModuleFieldType::Table, dst_table->name), ", ");

  // elem segment exprs needed only for funcref tables
  // because externref tables can only be initialized with ref.null
  if (dst_table->elem_type == Type::FuncRef) {
    if (src_segment->elem_exprs.empty()) {
      Write("NULL, ");
    } else {
      Write("elem_segment_exprs_",
            GlobalName(ModuleFieldType::ElemSegment, src_segment->name), ", ");
    }
  }

  // src_size, dest_addr, src_addr, N
  if (active_initialization) {
    Write(src_segment->elem_exprs.size(), ", ");
    WriteInitExpr(src_segment->offset);
    Write(", 0, ", src_segment->elem_exprs.size());
  } else {
    if (is_droppable(src_segment)) {
      Write("(instance->elem_segment_dropped_",
            GlobalName(ModuleFieldType::ElemSegment, src_segment->name),
            " ? 0 : ", src_segment->elem_exprs.size(), "), ");
    } else {
      Write("0, ");
    }
    Write(StackVar(2), ", ", StackVar(1), ", ", StackVar(0));
  }

  if (dst_table->elem_type == Type::FuncRef) {
    Write(", instance");
  }

  Write(");", Newline());
}